

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O2

greatest_test_res
validate_with_slow_max_flow(FlowNetwork *net,int32_t s,int32_t t,MaxFlowResult *result)

{
  greatest_test_res gVar1;
  MaxFlowResult bf_result;
  MaxFlow bf_maxflow;
  
  max_flow_result_create(&bf_result,net->nnodes);
  bf_maxflow.payload._32_8_ = 0;
  bf_maxflow.payload.field_1.list = (int32_t *)0x0;
  bf_maxflow.payload.field_0.temp_mf.colors = (int32_t *)0x0;
  bf_maxflow.payload.field_1.curr_neigh = (int32_t *)0x0;
  bf_maxflow.payload.field_1.flows = (flow_t *)0x0;
  bf_maxflow.payload.field_1.height = (int32_t *)0x0;
  bf_maxflow.nnodes = 0;
  bf_maxflow.s = 0;
  bf_maxflow.t = 0;
  bf_maxflow.kind = MAXFLOW_ALGO_INVALID;
  max_flow_create(&bf_maxflow,net->nnodes,MAXFLOW_ALGO_BRUTEFORCE);
  max_flow_single_pair(net,&bf_maxflow,s,t,&bf_result);
  greatest_info.assertions = greatest_info.assertions + 1;
  if (bf_result.maxflow == result->maxflow) {
    max_flow_result_destroy(&bf_result);
    max_flow_destroy(&bf_maxflow);
    greatest_info.msg = (char *)0x0;
    gVar1 = GREATEST_TEST_RES_PASS;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
    ;
    greatest_info.fail_line = 0x2e;
    greatest_info.msg = "bf_result.maxflow != result->maxflow";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    gVar1 = GREATEST_TEST_RES_FAIL;
  }
  return gVar1;
}

Assistant:

TEST validate_with_slow_max_flow(FlowNetwork *net, int32_t s, int32_t t,
                                 MaxFlowResult *result) {
    MaxFlowResult bf_result;
    max_flow_result_create(&bf_result, net->nnodes);

    MaxFlow bf_maxflow = {0};
    max_flow_create(&bf_maxflow, net->nnodes, MAXFLOW_ALGO_BRUTEFORCE);

    max_flow_single_pair(net, &bf_maxflow, s, t, &bf_result);
    ASSERT_EQ(bf_result.maxflow, result->maxflow);

    max_flow_result_destroy(&bf_result);
    max_flow_destroy(&bf_maxflow);

    PASS();
}